

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector_test.cc
# Opt level: O2

void __thiscall
fizplex::DVectorSVectorDotProductTest_ZeroVectors_Test::TestBody
          (DVectorSVectorDotProductTest_ZeroVectors_Test *this)

{
  char *message;
  double rhs_value;
  _Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> _Stack_48;
  DVector local_30;
  AssertionResult gtest_ar;
  
  DVector::DVector(&local_30,5);
  SVector::SVector((SVector *)&_Stack_48);
  rhs_value = DVector::operator*(&local_30,(SVector *)&_Stack_48);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"0.0","DVector(5) * SVector()",0.0,rhs_value);
  std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
  ~_Vector_base(&_Stack_48);
  operator_delete(local_30.vals._M_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&_Stack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/dvector_test.cc"
               ,0x2d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&_Stack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&_Stack_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(DVectorSVectorDotProductTest, ZeroVectors) {
  EXPECT_DOUBLE_EQ(0.0, DVector(5) * SVector());
}